

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void riscv_tr_tb_stop(DisasContextBase *dcbase,CPUState *cpu)

{
  DisasJumpType DVar1;
  TCGContext_conflict11 *pTVar2;
  TCGTemp *local_10;
  
  DVar1 = dcbase->is_jmp;
  if (DVar1 == DISAS_TARGET_6) {
    pTVar2 = *(TCGContext_conflict11 **)(dcbase[2].pc_first + 0x2e8);
    tcg_gen_op2_riscv64(pTVar2,INDEX_op_movi_i64,(TCGArg)(pTVar2->cpu_pc + (long)pTVar2),
                        dcbase->pc_next);
    pTVar2 = *(TCGContext_conflict11 **)(dcbase[2].pc_first + 0x2e8);
    local_10 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
    tcg_gen_callN_riscv64(pTVar2,helper_uc_riscv_exit_riscv64,(TCGTemp *)0x0,1,&local_10);
  }
  else if (DVar1 != DISAS_NORETURN) {
    if (DVar1 == DISAS_TOO_MANY) {
      gen_goto_tb((DisasContext_conflict12 *)dcbase,0,dcbase->pc_next);
      return;
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/translate.c"
               ,0x397,(char *)0x0);
  }
  return;
}

Assistant:

static void riscv_tr_tb_stop(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    switch (ctx->base.is_jmp) {
    case DISAS_TOO_MANY:
        gen_goto_tb(ctx, 0, ctx->base.pc_next);
        break;
    case DISAS_NORETURN:
        break;
    case DISAS_UC_EXIT:
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);
        gen_helper_uc_riscv_exit(ctx->uc->tcg_ctx, ctx->uc->tcg_ctx->cpu_env);
        break;
    default:
        g_assert_not_reached();
    }
}